

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O0

void __thiscall
lista_test_test_constructor_por_copia_Test::~lista_test_test_constructor_por_copia_Test
          (lista_test_test_constructor_por_copia_Test *this)

{
  lista_test_test_constructor_por_copia_Test *this_local;
  
  ~lista_test_test_constructor_por_copia_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(lista_test, test_constructor_por_copia) {
    Lista<int> l;
    l.agregarAtras(42);
    l.agregarAtras(43);
    l.agregarAtras(44);
    l.agregarAtras(45);

    Lista<int> otra(l);
    ASSERT_EQ(otra.longitud(), 4);
    ASSERT_EQ(otra.iesimo(0), 42);
    ASSERT_EQ(otra.iesimo(1), 43);
    ASSERT_EQ(otra.iesimo(2), 44);
    ASSERT_EQ(otra.iesimo(3), 45);

    // test aliasing interno
    l.iesimo(0) = 99;
    ASSERT_EQ(otra.iesimo(0), 42);
}